

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O1

void __thiscall b_tree::insert(b_tree *this,int64_t key,int64_t value)

{
  bool bVar1;
  uint64_t lastVal;
  bool bVar2;
  char *__format;
  uint uVar3;
  b_tree_node copied_root;
  b_tree_node new_root;
  b_tree_node local_100;
  b_tree_node local_98;
  
  bVar2 = false;
  uVar3 = 0;
  do {
    lastVal = pager::root_ofs(&this->_p);
    if (lastVal == 0) {
      b_tree_node::b_tree_node(&local_100,&this->_p,this->_min_degree,true);
      *local_100._num_keys_field = 1;
      *local_100._keys_field = key;
      *local_100._valid_keys_field = '\x01';
      *local_100._vals_field = value;
      bVar1 = pager::set_root_ofs(&this->_p,0,local_100._ofs_field);
      if (bVar1) goto LAB_00107ab2;
      __format = "Failed to set root ofs 1 %d\n";
LAB_00107abe:
      printf(__format,(ulong)uVar3);
      uVar3 = uVar3 + 1;
    }
    else {
      printf("Copied arm ofs: ");
      _copy_arm(&local_100,this,key,lastVal);
      putchar(10);
      if ((uint)this->_min_degree * 2 - 1 == (uint)*local_100._num_keys_field) {
        puts("Root is full");
        b_tree_node::b_tree_node(&local_98,&this->_p,this->_min_degree,false);
        *local_98._child_ofs_field = local_100._ofs_field;
        b_tree_node::_split_child(&local_98,0,local_100._ofs_field);
        printf("insert ofs s: ");
        _insert_atomic_recursive(this,key,value,local_98._ofs_field);
        putchar(10);
        bVar1 = pager::set_root_ofs(&this->_p,lastVal,local_98._ofs_field);
        if (bVar1) {
          bVar2 = true;
        }
        else {
          printf("Failed to set root ofs 2 %d\n",(ulong)uVar3);
          uVar3 = uVar3 + 1;
        }
        r_memory_map::~r_memory_map(&local_98._mm);
      }
      else {
        printf("insert ofs: ");
        _insert_atomic_recursive(this,key,value,local_100._ofs_field);
        putchar(10);
        bVar1 = pager::set_root_ofs(&this->_p,lastVal,local_100._ofs_field);
        if (!bVar1) {
          __format = "Failed to set root ofs 3 %d\n";
          goto LAB_00107abe;
        }
LAB_00107ab2:
        bVar2 = true;
      }
    }
    r_memory_map::~r_memory_map(&local_100._mm);
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void b_tree::insert(int64_t key, int64_t value) {
    bool inserted = false;
    int attempt = 0;
    while (!inserted) {
        int64_t old_root_ofs = _p.root_ofs();
        if (old_root_ofs == 0) {
            // If the tree is empty, create a new root node and insert the key-value pair
            b_tree_node root(_p, _min_degree, true);
            root._set_num_keys(1);
            root._set_key(0, key);
            root._set_valid_key(0, true);
            root._set_val(0, value);
            if(_p.set_root_ofs(0, root._ofs()))
                inserted = true;
            else { printf("Failed to set root ofs 1 %d\n",attempt); ++attempt; }
        } else {
            // Copy the arm of the tree from the root to the leaf node
            printf("Copied arm ofs: ");
            b_tree_node copied_root = _copy_arm(key, old_root_ofs);
            printf("\n");

            // Traverse down the copied arm and insert the key-value pair
            if (copied_root._num_keys() == 2 * _min_degree - 1) {
                printf("Root is full\n");
                // If the root node is full, split it preemptively
                b_tree_node new_root(_p, _min_degree, false);
                new_root._set_child_ofs(0, copied_root._ofs());
                new_root._split_child(0, copied_root._ofs());
                printf("insert ofs s: ");
                _insert_atomic_recursive(key, value, new_root._ofs());
                printf("\n");

                if(_p.set_root_ofs(old_root_ofs, new_root._ofs()))
                    inserted = true;
                else { printf("Failed to set root ofs 2 %d\n",attempt); ++attempt; }
            }
            else
            {
                printf("insert ofs: ");
                _insert_atomic_recursive(key, value, copied_root._ofs());
                printf("\n");
                if(_p.set_root_ofs(old_root_ofs, copied_root._ofs()))
                    inserted = true;
                else { printf("Failed to set root ofs 3 %d\n",attempt); ++attempt; }
            }
        }
    }
}